

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::dht_tracker::incoming_error(dht_tracker *this,error_code *ec,endpoint *ep)

{
  bool bVar1;
  _Base_ptr p_Var2;
  error_code local_48;
  error_code local_38;
  error_code local_28;
  
  local_28 = boost::asio::error::make_error_code(connection_refused);
  bVar1 = boost::system::operator==(ec,&local_28);
  if (!bVar1) {
    local_38 = boost::asio::error::make_error_code(connection_reset);
    bVar1 = boost::system::operator==(ec,&local_38);
    if (!bVar1) {
      local_48 = boost::asio::error::make_error_code(connection_aborted);
      bVar1 = boost::system::operator==(ec,&local_48);
      if (!bVar1) {
        return;
      }
    }
  }
  for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    dht::node::unreachable((node *)&p_Var2[1]._M_left,ep);
  }
  return;
}

Assistant:

void dht_tracker::incoming_error(error_code const& ec, udp::endpoint const& ep)
	{
		if (ec == boost::asio::error::connection_refused
			|| ec == boost::asio::error::connection_reset
			|| ec == boost::asio::error::connection_aborted
#ifdef _WIN32
			|| ec == error_code(ERROR_HOST_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_PORT_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_CONNECTION_REFUSED, system_category())
			|| ec == error_code(ERROR_CONNECTION_ABORTED, system_category())
#endif
			)
		{
			for (auto& n : m_nodes)
				n.second.dht.unreachable(ep);
		}
	}